

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

void pzshape::TPZShapeDisc::Shape
               (int dimension,REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,MShapeType type)

{
  ostream *poVar1;
  
  if (3 < (uint)dimension) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\nFATAL ERROR at ");
    poVar1 = std::operator<<(poVar1,
                             "static void pzshape::TPZShapeDisc::Shape(int, REAL, TPZVec<REAL> &, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, MShapeType)"
                            );
    std::operator<<(poVar1,"\n");
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeDisc.cpp"
               ,0xee);
  }
  switch(dimension) {
  case 0:
    Shape0D(C,(TPZVec<double> *)
              ((long)&switchD_00f4fc7c::switchdataD_01309ab0 +
              (long)(int)(&switchD_00f4fc7c::switchdataD_01309ab0)[(uint)dimension]),X0,degree,phi,
            dphi);
    return;
  case 1:
    Shape1D(C,X0,X,degree,phi,dphi);
    return;
  case 3:
    Shape3D(C,X0,X,degree,phi,dphi,type);
    return;
  }
  if (type < ETensorialFull) {
    Shape2D(C,X0,X,degree,phi,dphi,type);
    return;
  }
  Shape2DFull(C,X0,X,degree,phi,dphi,type);
  return;
}

Assistant:

void TPZShapeDisc::Shape(int dimension, REAL C,TPZVec<REAL> &X0,TPZVec<REAL> &X,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, MShapeType type){
  switch (dimension){
    case(0) :{
      TPZShapeDisc::Shape0D(C,X0,X,degree,phi,dphi);
      break;
    }
    case(1) : {
      TPZShapeDisc::Shape1D(C,X0,X,degree,phi,dphi);
      break;
    }
    case(2) : {
      if(type == ETensorial || type == EOrdemTotal){
        TPZShapeDisc::Shape2D(C,X0,X,degree,phi,dphi,type);
      }
      else{
        TPZShapeDisc::Shape2DFull(C,X0,X,degree,phi,dphi,type);
      }
      break;
    }
    case(3) : {
      TPZShapeDisc::Shape3D(C,X0,X,degree,phi,dphi,type);
      break;
    }
    default:{
      PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
      PZError.flush();
      DebugStop();
    }
  }
}